

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# accessors.h
# Opt level: O0

void upb_Message_SetBaseFieldInt64(upb_Message *msg,upb_MiniTableField *f,int64_t value)

{
  bool bVar1;
  upb_CType uVar2;
  upb_FieldRep uVar3;
  int64_t local_20;
  int64_t value_local;
  upb_MiniTableField *f_local;
  upb_Message *msg_local;
  
  local_20 = value;
  value_local = (int64_t)f;
  f_local = (upb_MiniTableField *)msg;
  uVar2 = upb_MiniTableField_CType(f);
  if (uVar2 != kUpb_CType_Int64) {
    __assert_fail("upb_MiniTableField_CType(f) == kUpb_CType_Int64",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/message/internal/accessors.h"
                  ,0x27c,
                  "void upb_Message_SetBaseFieldInt64(struct upb_Message *, const upb_MiniTableField *, int64_t)"
                 );
  }
  bVar1 = upb_MiniTableField_IsScalar((upb_MiniTableField *)value_local);
  if (!bVar1) {
    __assert_fail("upb_MiniTableField_IsScalar(f)",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/message/internal/accessors.h"
                  ,0x27d,
                  "void upb_Message_SetBaseFieldInt64(struct upb_Message *, const upb_MiniTableField *, int64_t)"
                 );
  }
  uVar3 = _upb_MiniTableField_GetRep_dont_copy_me__upb_internal_use_only
                    ((upb_MiniTableField *)value_local);
  if (uVar3 == kUpb_FieldRep_8Byte) {
    upb_Message_SetBaseField((upb_Message *)f_local,(upb_MiniTableField *)value_local,&local_20);
    return;
  }
  __assert_fail("_upb_MiniTableField_GetRep_dont_copy_me__upb_internal_use_only(f) == kUpb_FieldRep_8Byte"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/message/internal/accessors.h"
                ,0x27e,
                "void upb_Message_SetBaseFieldInt64(struct upb_Message *, const upb_MiniTableField *, int64_t)"
               );
}

Assistant:

UPB_API_INLINE void upb_Message_SetBaseFieldInt64(struct upb_Message* msg,
                                                  const upb_MiniTableField* f,
                                                  int64_t value) {
  UPB_ASSUME(upb_MiniTableField_CType(f) == kUpb_CType_Int64);
  UPB_ASSUME(upb_MiniTableField_IsScalar(f));
  UPB_ASSUME(UPB_PRIVATE(_upb_MiniTableField_GetRep)(f) == kUpb_FieldRep_8Byte);
  upb_Message_SetBaseField(msg, f, &value);
}